

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  FT_ListNode local_40;
  FT_ListNode node;
  FT_Renderer_conflict renderer;
  FT_Raster_Params *pFStack_28;
  FT_Error error;
  FT_Raster_Params *params_local;
  FT_Outline *outline_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (outline == (FT_Outline *)0x0) {
    library_local._4_4_ = 0x14;
  }
  else if (params == (FT_Raster_Params *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    node = (FT_ListNode)library->cur_renderer;
    local_40 = (library->renderers).head;
    params->source = outline;
    renderer._4_4_ = 0x13;
    pFStack_28 = params;
    params_local = (FT_Raster_Params *)outline;
    outline_local = (FT_Outline *)library;
    while (((node != (FT_ListNode)0x0 &&
            (renderer._4_4_ = (*(code *)node[4].data)(node[4].next,pFStack_28), renderer._4_4_ != 0)
            ) && ((renderer._4_4_ & 0xff) == 0x13))) {
      node = (FT_ListNode)
             FT_Lookup_Renderer((FT_Library)outline_local,FT_GLYPH_FORMAT_OUTLINE,&local_40);
    }
    library_local._4_4_ = renderer._4_4_;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }